

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

shared_ptr<Label> __thiscall
SymbolTable::getLabel(SymbolTable *this,Identifier *symbol,int file,int section)

{
  int iVar1;
  bool bVar2;
  mapped_type *pmVar3;
  element_type *peVar4;
  pointer ppVar5;
  reference pvVar6;
  undefined4 in_register_00000014;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  int in_R8D;
  shared_ptr<Label> sVar8;
  Identifier local_b0;
  undefined1 local_89;
  undefined4 uStack_88;
  undefined4 uStack_84;
  SymbolInfo value;
  _Self local_60;
  iterator it;
  SymbolKey key;
  int local_28;
  int actualSection;
  int section_local;
  int file_local;
  Identifier *symbol_local;
  SymbolTable *this_local;
  shared_ptr<Label> *result;
  
  _section_local = (Identifier *)CONCAT44(in_register_00000014,file);
  local_28 = in_R8D;
  actualSection = section;
  symbol_local = symbol;
  this_local = this;
  bVar2 = isValidSymbolName(_section_local);
  iVar1 = local_28;
  if (bVar2) {
    setFileSectionValues((SymbolTable *)symbol,_section_local,&actualSection,&local_28);
    SymbolKey::SymbolKey((SymbolKey *)&it,_section_local,actualSection,local_28);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
         ::find((map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
                 *)symbol,(SymbolKey *)&it);
    value.index = (size_t)std::
                          map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
                          ::end((map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
                                 *)symbol);
    bVar2 = std::operator==(&local_60,(_Self *)&value.index);
    if (bVar2) {
      uStack_88 = 0;
      value._0_8_ = std::vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>::
                    size((vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_> *
                         )&symbol[1]._name.field_2);
      pmVar3 = std::
               map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
               ::operator[]((map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
                             *)symbol,(key_type *)&it);
      *(ulong *)pmVar3 = CONCAT44(uStack_84,uStack_88);
      pmVar3->index = value._0_8_;
      local_89 = 0;
      Identifier::Identifier(&local_b0,_section_local);
      std::make_shared<Label,Identifier>((Identifier *)this);
      Identifier::~Identifier(&local_b0);
      if (local_28 == iVar1) {
        peVar4 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            this);
        Label::setSection(peVar4,local_28);
      }
      else {
        peVar4 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            this);
        Label::setSection(peVar4,iVar1 + 1);
      }
      std::vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>::push_back
                ((vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_> *)
                 &symbol[1]._name.field_2,(value_type *)this);
      local_89 = 1;
    }
    else {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>::
               operator->(&local_60);
      if ((ppVar5->second).type == LabelSymbol) {
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>::
                 operator->(&local_60);
        pvVar6 = std::vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>::
                 operator[]((vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>
                             *)&symbol[1]._name.field_2,(ppVar5->second).index);
        std::shared_ptr<Label>::shared_ptr((shared_ptr<Label> *)this,pvVar6);
      }
      else {
        std::shared_ptr<Label>::shared_ptr((shared_ptr<Label> *)this,(nullptr_t)0x0);
      }
    }
    SymbolKey::~SymbolKey((SymbolKey *)&it);
    _Var7._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<Label>::shared_ptr((shared_ptr<Label> *)this,(nullptr_t)0x0);
    _Var7._M_pi = extraout_RDX;
  }
  sVar8.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi;
  sVar8.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Label>)sVar8.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Label> SymbolTable::getLabel(const Identifier& symbol, int file, int section)
{
	if (!isValidSymbolName(symbol))
		return nullptr;

	int actualSection = section;
	setFileSectionValues(symbol,file,section);
	SymbolKey key = { symbol, file, section };

	// find label, create new one if it doesn't exist
	auto it = symbols.find(key);
	if (it == symbols.end())
	{
		SymbolInfo value = { LabelSymbol, labels.size() };
		symbols[key] = value;
		
		std::shared_ptr<Label> result = std::make_shared<Label>(Identifier(symbol));
		if (section == actualSection)
			result->setSection(section);			// local, set section of parent
		else
			result->setSection(actualSection+1);	// global, set section of children
		labels.push_back(result);
		return result;
	}

	// make sure not to match symbols that aren't labels
	if (it->second.type != LabelSymbol)
		return nullptr;

	return labels[it->second.index];
}